

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  size_type sVar1;
  pointer pcVar2;
  string *__range2;
  size_type sVar3;
  string normalized_pathname;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  std::__cxx11::string::reserve((ulong)&local_50);
  sVar1 = (this->pathname_)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->pathname_)._M_dataplus._M_p;
    sVar3 = 0;
    do {
      if (((pcVar2[sVar3] != '/') || (local_48 == 0)) || (local_50[local_48 + -1] != '/')) {
        std::__cxx11::string::push_back((char)&local_50);
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  std::__cxx11::string::_M_assign((string *)this);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void FilePath::Normalize() {
  std::string normalized_pathname;
  normalized_pathname.reserve(pathname_.length());

  for (const char character : pathname_) {
    if (!IsPathSeparator(character)) {
      normalized_pathname.push_back(character);
    } else if (normalized_pathname.empty() ||
               normalized_pathname.back() != kPathSeparator) {
      normalized_pathname.push_back(kPathSeparator);
    } else {
      continue;
    }
  }

  pathname_ = normalized_pathname;
}